

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSFFile.cpp
# Opt level: O0

PSFFile * PSFFile::load(string *filename)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  size_t sVar7;
  void *pvVar8;
  char *pcVar9;
  pointer ppVar10;
  __type local_219;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  const_iterator local_138;
  _Self local_130;
  _Self local_128;
  iterator it;
  string local_118 [8];
  string tag_var_value;
  allocator local_f1;
  string local_f0 [8];
  string tag_var_name;
  char *local_d0;
  char *ptr_value_end;
  char *ptr_value;
  char *ptr_name_end;
  char *ptr_name;
  char *ptr_separator;
  char *ptr_newline;
  size_t off_curtag;
  char *tag_chrs;
  size_t tag_size;
  undefined1 auStack_7c [3];
  uint8_t tag_marker [5];
  uint32_t compressed_exe_crc;
  uint8_t *compressed_exe_data;
  size_t i;
  uint8_t *reserved_data;
  PSFFile *psf;
  uint32_t compressed_exe_crc_expected;
  uint32_t compressed_exe_size;
  uint32_t reserved_size;
  uint8_t version;
  uint8_t sig [3];
  FILE *fp;
  size_t psf_size;
  off_t off_psf_size;
  string *psStack_18;
  uint8_t data [4];
  string *filename_local;
  
  psStack_18 = filename;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  uVar6 = path_getfilesize(pcVar5);
  if ((long)uVar6 < 0) {
    filename_local = (string *)0x0;
  }
  else {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    _reserved_size = fopen(pcVar5,"rb");
    if (_reserved_size == (FILE *)0x0) {
      filename_local = (string *)0x0;
    }
    else {
      sVar7 = fread((void *)((long)&compressed_exe_size + 1),1,3,_reserved_size);
      if (sVar7 == 3) {
        iVar4 = memcmp((void *)((long)&compressed_exe_size + 1),"PSF",3);
        if (iVar4 == 0) {
          sVar7 = fread((void *)((long)&off_psf_size + 4),1,1,_reserved_size);
          if (sVar7 == 1) {
            compressed_exe_size._0_1_ = off_psf_size._4_1_;
            sVar7 = fread((void *)((long)&off_psf_size + 4),1,4,_reserved_size);
            uVar1 = off_psf_size._4_4_;
            if (sVar7 == 4) {
              sVar7 = fread((void *)((long)&off_psf_size + 4),1,4,_reserved_size);
              uVar2 = off_psf_size._4_4_;
              if (sVar7 == 4) {
                sVar7 = fread((void *)((long)&off_psf_size + 4),1,4,_reserved_size);
                if (sVar7 == 4) {
                  if (uVar6 < uVar1 + 0x10 + uVar2) {
                    fclose(_reserved_size);
                    filename_local = (string *)0x0;
                  }
                  else {
                    filename_local = (string *)operator_new(0x110);
                    PSFFile((PSFFile *)filename_local);
                    ((PSFFile *)filename_local)->version = (uint8_t)compressed_exe_size;
                    pvVar8 = operator_new__((ulong)uVar1);
                    sVar7 = fread(pvVar8,1,(ulong)uVar1,_reserved_size);
                    if (sVar7 == uVar1) {
                      for (compressed_exe_data = (uint8_t *)0x0;
                          compressed_exe_data < (uint8_t *)(ulong)uVar1;
                          compressed_exe_data = compressed_exe_data + 1) {
                        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                                  (&((PSFFile *)filename_local)->reserved,
                                   (value_type_conflict *)((long)pvVar8 + (long)compressed_exe_data)
                                  );
                      }
                      if (pvVar8 != (void *)0x0) {
                        operator_delete__(pvVar8);
                      }
                      register0x00000000 = operator_new__((ulong)uVar2);
                      sVar7 = fread(register0x00000000,1,(ulong)uVar2,_reserved_size);
                      if (sVar7 == uVar2) {
                        _auStack_7c = ZlibReader::crc32(stack0xffffffffffffff88,(ulong)uVar2);
                        if (_auStack_7c == off_psf_size._4_4_) {
                          ZlibReader::assign(&((PSFFile *)filename_local)->compressed_exe,
                                             stack0xffffffffffffff88,(ulong)uVar2);
                          if (stack0xffffffffffffff88 != (void *)0x0) {
                            operator_delete__(stack0xffffffffffffff88);
                          }
                          sVar7 = fread((void *)((long)&tag_size + 7),1,5,_reserved_size);
                          if (sVar7 == 5) {
                            iVar4 = memcmp((void *)((long)&tag_size + 7),"[TAG]",5);
                            if (iVar4 == 0) {
                              pcVar5 = (char *)(uVar6 - (uVar1 + uVar2 + 0x15));
                              pvVar8 = operator_new__((ulong)(pcVar5 + 1));
                              pcVar9 = (char *)fread(pvVar8,1,(size_t)pcVar5,_reserved_size);
                              if (pcVar9 == pcVar5) {
                                *(char *)((long)pvVar8 + (long)pcVar5) = '\0';
                                ptr_newline = (char *)0x0;
                                while (ptr_newline < pcVar5) {
                                  ptr_separator =
                                       strchr((char *)((long)pvVar8 + (long)ptr_newline),10);
                                  if (ptr_separator == (char *)0x0) {
                                    ptr_separator = (char *)((long)pvVar8 + (long)pcVar5);
                                  }
                                  *ptr_separator = '\0';
                                  ptr_value = strchr((char *)((long)pvVar8 + (long)ptr_newline),0x3d
                                                    );
                                  if (ptr_value == (char *)0x0) {
                                    ptr_newline = ptr_separator + (1 - (long)pvVar8);
                                  }
                                  else {
                                    ptr_name_end = (char *)((long)pvVar8 + (long)ptr_newline);
                                    ptr_value_end = ptr_value + 1;
                                    local_d0 = ptr_separator;
                                    while( true ) {
                                      bVar3 = false;
                                      if (ptr_name_end < ptr_value) {
                                        bVar3 = (byte)ptr_value[-1] < 0x21;
                                      }
                                      if (!bVar3) break;
                                      ptr_value = ptr_value + -1;
                                    }
                                    while( true ) {
                                      bVar3 = false;
                                      if (ptr_value_end < local_d0) {
                                        bVar3 = (byte)local_d0[-1] < 0x21;
                                      }
                                      if (!bVar3) break;
                                      local_d0 = local_d0 + -1;
                                    }
                                    while( true ) {
                                      bVar3 = false;
                                      if (ptr_name_end < ptr_value) {
                                        bVar3 = (byte)*ptr_name_end < 0x21;
                                      }
                                      if (!bVar3) break;
                                      ptr_name_end = ptr_name_end + 1;
                                    }
                                    while( true ) {
                                      bVar3 = false;
                                      if (ptr_value_end < local_d0) {
                                        bVar3 = (byte)*ptr_value_end < 0x21;
                                      }
                                      if (!bVar3) break;
                                      ptr_value_end = ptr_value_end + 1;
                                    }
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              (local_f0,ptr_name_end,
                                               (long)ptr_value - (long)ptr_name_end,&local_f1);
                                    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              (local_118,ptr_value_end,
                                               (long)local_d0 - (long)ptr_value_end,
                                               (allocator *)((long)&it._M_node + 7));
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)((long)&it._M_node + 7));
                                    local_128._M_node =
                                         (_Base_ptr)
                                         std::
                                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ::lower_bound(&((PSFFile *)filename_local)->tags,
                                                       (key_type *)local_f0);
                                    local_130._M_node =
                                         (_Base_ptr)
                                         std::
                                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ::end(&((PSFFile *)filename_local)->tags);
                                    bVar3 = std::operator!=(&local_128,&local_130);
                                    local_219 = false;
                                    if (bVar3) {
                                      ppVar10 = std::
                                                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::operator->(&local_128);
                                      local_219 = std::operator==(&ppVar10->first,
                                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f0);
                                    }
                                    if (local_219 == false) {
                                      std::
                                      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::_Rb_tree_const_iterator(&local_138,&local_128);
                                      std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                                                (&local_178,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_f0,
                                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_118);
                                      std::
                                      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                      ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                                                ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                                                  *)&((PSFFile *)filename_local)->tags,local_138,
                                                 &local_178);
                                      std::
                                      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::~pair(&local_178);
                                    }
                                    else {
                                      ppVar10 = std::
                                                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::operator->(&local_128);
                                      std::__cxx11::string::operator+=
                                                ((string *)&ppVar10->second,"\n");
                                      ppVar10 = std::
                                                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ::operator->(&local_128);
                                      std::__cxx11::string::operator+=
                                                ((string *)&ppVar10->second,local_118);
                                    }
                                    ptr_newline = ptr_separator + (1 - (long)pvVar8);
                                    std::__cxx11::string::~string(local_118);
                                    std::__cxx11::string::~string(local_f0);
                                  }
                                }
                                if (pvVar8 != (void *)0x0) {
                                  operator_delete__(pvVar8);
                                }
                                fclose(_reserved_size);
                              }
                              else {
                                if (pvVar8 != (void *)0x0) {
                                  operator_delete__(pvVar8);
                                }
                                if ((PSFFile *)filename_local != (PSFFile *)0x0) {
                                  (*((PSFFile *)filename_local)->_vptr_PSFFile[1])();
                                }
                                fclose(_reserved_size);
                                filename_local = (string *)0x0;
                              }
                            }
                            else {
                              fclose(_reserved_size);
                            }
                          }
                          else {
                            fclose(_reserved_size);
                          }
                        }
                        else {
                          if (stack0xffffffffffffff88 != (void *)0x0) {
                            operator_delete__(stack0xffffffffffffff88);
                          }
                          if ((PSFFile *)filename_local != (PSFFile *)0x0) {
                            (*((PSFFile *)filename_local)->_vptr_PSFFile[1])();
                          }
                          fclose(_reserved_size);
                          filename_local = (string *)0x0;
                        }
                      }
                      else {
                        if (stack0xffffffffffffff88 != (void *)0x0) {
                          operator_delete__(stack0xffffffffffffff88);
                        }
                        if ((PSFFile *)filename_local != (PSFFile *)0x0) {
                          (*((PSFFile *)filename_local)->_vptr_PSFFile[1])();
                        }
                        fclose(_reserved_size);
                        filename_local = (string *)0x0;
                      }
                    }
                    else {
                      if (pvVar8 != (void *)0x0) {
                        operator_delete__(pvVar8);
                      }
                      if ((PSFFile *)filename_local != (PSFFile *)0x0) {
                        (*((PSFFile *)filename_local)->_vptr_PSFFile[1])();
                      }
                      fclose(_reserved_size);
                      filename_local = (string *)0x0;
                    }
                  }
                }
                else {
                  fclose(_reserved_size);
                  filename_local = (string *)0x0;
                }
              }
              else {
                fclose(_reserved_size);
                filename_local = (string *)0x0;
              }
            }
            else {
              fclose(_reserved_size);
              filename_local = (string *)0x0;
            }
          }
          else {
            fclose(_reserved_size);
            filename_local = (string *)0x0;
          }
        }
        else {
          fclose(_reserved_size);
          filename_local = (string *)0x0;
        }
      }
      else {
        fclose(_reserved_size);
        filename_local = (string *)0x0;
      }
    }
  }
  return (PSFFile *)filename_local;
}

Assistant:

PSFFile * PSFFile::load(const std::string& filename)
{
	uint8_t data[4];

	off_t off_psf_size = path_getfilesize(filename.c_str());
	if (off_psf_size < 0)
	{
		return NULL;
	}
	size_t psf_size = (size_t) off_psf_size;

	FILE * fp = fopen(filename.c_str(), "rb");
	if (fp == NULL)
	{
		return NULL;
	}

	// signature
	uint8_t sig[PSF_SIGNATURE_SIZE];
	if (fread(sig, 1, PSF_SIGNATURE_SIZE, fp) != PSF_SIGNATURE_SIZE)
	{
		fclose(fp);
		return NULL;
	}
	if (memcmp(sig, PSF_SIGNATURE, PSF_SIGNATURE_SIZE) != 0)
	{
		fclose(fp);
		return NULL;
	}

	// version number
	if (fread(data, 1, 1, fp) != 1)
	{
		fclose(fp);
		return NULL;
	}
	uint8_t version = data[0];

	// size of reserved area
	if (fread(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return NULL;
	}
	uint32_t reserved_size = data[0] | (data[1] << 8) | (data[2] << 16) | (data[3] << 24);

	// size of compressed program
	if (fread(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return NULL;
	}
	uint32_t compressed_exe_size = data[0] | (data[1] << 8) | (data[2] << 16) | (data[3] << 24);

	// crc32 of compressed program
	if (fread(data, 1, 4, fp) != 4)
	{
		fclose(fp);
		return NULL;
	}
	uint32_t compressed_exe_crc_expected = data[0] | (data[1] << 8) | (data[2] << 16) | (data[3] << 24);

	// check the size consistency beforehand
	if (0x10 + reserved_size + compressed_exe_size > psf_size)
	{
		fclose(fp);
		return NULL;
	}

	// create new PSF object
	PSFFile * psf = new PSFFile();
	psf->version = version;

	// reserved area
	uint8_t * reserved_data = new uint8_t[reserved_size];
	if (fread(reserved_data, 1, reserved_size, fp) != reserved_size)
	{
		delete [] reserved_data;
		delete psf;
		fclose(fp);
		return NULL;
	}
	// set to vector
	for (size_t i = 0; i < reserved_size; i++)
	{
		psf->reserved.push_back(reserved_data[i]);
	}
	delete [] reserved_data;

	// compressed exe
	uint8_t * compressed_exe_data = new uint8_t[compressed_exe_size];
	if (fread(compressed_exe_data, 1, compressed_exe_size, fp) != compressed_exe_size)
	{
		delete [] compressed_exe_data;
		delete psf;
		fclose(fp);
		return NULL;
	}
	// test crc32
	uint32_t compressed_exe_crc = ZlibReader::crc32(compressed_exe_data, compressed_exe_size);
	if (compressed_exe_crc != compressed_exe_crc_expected)
	{
		delete [] compressed_exe_data;
		delete psf;
		fclose(fp);
		return NULL;
	}
	// set to ZlibReader
	psf->compressed_exe.assign(compressed_exe_data, compressed_exe_size);
	delete [] compressed_exe_data;

	// check tag marker (optional)
	uint8_t tag_marker[PSF_TAG_MARKER_SIZE];
	if (fread(tag_marker, 1, PSF_TAG_MARKER_SIZE, fp) != PSF_TAG_MARKER_SIZE)
	{
		// no tags
		fclose(fp);
		return psf;
	}
	if (memcmp(tag_marker, PSF_TAG_MARKER, PSF_TAG_MARKER_SIZE) != 0)
	{
		// no tags
		fclose(fp);
		return psf;
	}

	// read entire tag area
	size_t tag_size = psf_size - (0x10 + reserved_size + compressed_exe_size + PSF_TAG_MARKER_SIZE);
	char * tag_chrs = new char[tag_size + 1];
	if (fread(tag_chrs, 1, tag_size, fp) != tag_size)
	{
		// I/O error
		delete [] tag_chrs;
		delete psf;
		fclose(fp);
		return NULL;
	}
	tag_chrs[tag_size] = '\0';

	// Parse tag section. Details are available here:
	// http://wiki.neillcorlett.com/PSFTagFormat
	size_t off_curtag = 0;
	while (off_curtag < tag_size)
	{
		// Search the end position of the current line.
		char* ptr_newline = strchr(&tag_chrs[off_curtag], 0x0a);
		if (ptr_newline == NULL)
		{
			// Tag section must end with a newline.
			// Read the all remaining bytes if a newline lacks though.
			ptr_newline = tag_chrs + tag_size;
		}

		// Replace the newline with NUL,
		// for better C string function compatibility.
		*ptr_newline = '\0';

		// Search the variable=value separator.
		char* ptr_separator = strchr(&tag_chrs[off_curtag], '=');
		if (ptr_separator == NULL)
		{
			// Blank lines, or lines not of the form "variable=value", are ignored.
			off_curtag = ptr_newline + 1 - tag_chrs;
			continue;
		}

		// Determine the start/end position of variable.
		char* ptr_name = &tag_chrs[off_curtag];
		char* ptr_name_end = ptr_separator;
		char* ptr_value = ptr_separator + 1;
		char* ptr_value_end = ptr_newline;

		// Whitespace at the beginning/end of the line and before/after the = are ignored.
		// All characters 0x01-0x20 are considered whitespace.
		// (There must be no null (0x00) characters.)
		// Trim them.
		while (ptr_name_end > ptr_name && *(unsigned char*)(ptr_name_end - 1) <= 0x20)
			ptr_name_end--;
		while (ptr_value_end > ptr_value && *(unsigned char*)(ptr_value_end - 1) <= 0x20)
			ptr_value_end--;
		while (ptr_name < ptr_name_end && *(unsigned char*)ptr_name <= 0x20)
			ptr_name++;
		while (ptr_value < ptr_value_end && *(unsigned char*)ptr_value <= 0x20)
			ptr_value++;

		// Read variable=value as string.
		std::string tag_var_name(ptr_name, ptr_name_end - ptr_name);
		std::string tag_var_value(ptr_value, ptr_value_end - ptr_value);

		// Multiple-line variables must appear as consecutive lines using the same variable name.
		// For instance:
		//   comment=This is a
		//   comment=multiple-line
		//   comment=comment.
		// Therefore, check if the variable had already appeared.
		std::map<std::string, std::string>::iterator it = psf->tags.lower_bound(tag_var_name);
		if (it != psf->tags.end() && it->first == tag_var_name)
		{
			it->second += "\n";
			it->second += tag_var_value;
		}
		else
		{
			psf->tags.insert(it, make_pair(tag_var_name, tag_var_value));
		}

		off_curtag = ptr_newline + 1 - tag_chrs;
	}
	delete[] tag_chrs;
	fclose(fp);

	return psf;
}